

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tokpragma(tokcxdef *ctx,char *p,int len)

{
  ushort **ppuVar1;
  int in_EDX;
  errcxdef *in_RSI;
  long in_RDI;
  undefined2 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffea;
  undefined1 in_stack_ffffffffffffffeb;
  bool bVar2;
  
  if (in_EDX == 0) {
    errlogf(in_RSI,(char *)(ulong)CONCAT13(in_stack_ffffffffffffffeb,
                                           CONCAT12(in_stack_ffffffffffffffea,
                                                    in_stack_ffffffffffffffe8)),0);
  }
  else if (((in_EDX < 2) ||
           ((*(char *)&in_RSI->errcxptr != 'c' && (*(char *)&in_RSI->errcxptr != 'C')))) ||
          ((*(char *)((long)&in_RSI->errcxptr + 1) != '+' &&
           ((*(char *)((long)&in_RSI->errcxptr + 1) != '-' &&
            ((0x7f < *(byte *)((long)&in_RSI->errcxptr + 1) ||
             (ppuVar1 = __ctype_b_loc(),
             ((*ppuVar1)[(int)(uint)*(byte *)((long)&in_RSI->errcxptr + 1)] & 0x2000) == 0)))))))) {
    errlogf(in_RSI,(char *)CONCAT44(in_EDX,CONCAT13(in_stack_ffffffffffffffeb,
                                                    CONCAT12(in_stack_ffffffffffffffea,
                                                             in_stack_ffffffffffffffe8))),0);
  }
  else {
    do {
      in_RSI = (errcxdef *)((long)&in_RSI->errcxptr + 1);
      in_EDX = in_EDX + -1;
      bVar2 = false;
      if ((in_EDX != 0) &&
         (in_stack_ffffffffffffffea = false, bVar2 = (bool)in_stack_ffffffffffffffea,
         *(byte *)&in_RSI->errcxptr < 0x80)) {
        ppuVar1 = __ctype_b_loc();
        in_stack_ffffffffffffffea =
             ((*ppuVar1)[(int)(uint)*(byte *)&in_RSI->errcxptr] & 0x2000) != 0;
        bVar2 = (bool)in_stack_ffffffffffffffea;
      }
    } while (bVar2 != false);
    if ((in_EDX == 0) || (*(char *)&in_RSI->errcxptr != '+')) {
      if ((in_EDX == 0) || (*(char *)&in_RSI->errcxptr != '-')) {
        errlogf(in_RSI,(char *)CONCAT44(in_EDX,(uint)CONCAT12(in_stack_ffffffffffffffea,
                                                              in_stack_ffffffffffffffe8)),0);
      }
      else {
        *(uint *)(in_RDI + 0x11c) = *(uint *)(in_RDI + 0x11c) & 0xfffffffb;
      }
    }
    else {
      *(uint *)(in_RDI + 0x11c) = *(uint *)(in_RDI + 0x11c) | 4;
    }
  }
  return;
}

Assistant:

static void tokpragma(tokcxdef *ctx, char *p, int len)
{
    /* ignore empty pragmas */
    if (len == 0)
    {
        errlog(ctx->tokcxerr, ERR_PRAGMA);
        return;
    }

    /* see what we have */
    if (len > 1
        && (*p == 'c' || *p == 'C')
        && (*(p+1) == '+' || *(p+1) == '-' || t_isspace(*(p+1))))
    {
        /* skip spaces after the 'C', if any */
        for (++p, --len ; len && t_isspace(*p) ; ++p, --len) ;

        /* look for the + or - flag */
        if (len && *p == '+')
            ctx->tokcxflg |= TOKCXFCMODE;
        else if (len && *p == '-')
            ctx->tokcxflg &= ~TOKCXFCMODE;
        else
        {
            errlog(ctx->tokcxerr, ERR_PRAGMA);
            return;
        }
    }
    else
    {
        errlog(ctx->tokcxerr, ERR_PRAGMA);
    }
}